

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codepage_converter.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  _Head_base<0UL,_booster::locale::util::base_converter_*,_false> _Var2;
  _Head_base<0UL,_booster::locale::util::base_converter_*,_false> _Var3;
  char cVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  pointer __old_p;
  pointer __old_p_1;
  _Head_base<0UL,_booster::locale::util::base_converter_*,_false> local_70;
  char buf [32];
  undefined1 local_48 [7];
  allocator local_41;
  __uniq_ptr_impl<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  local_40;
  unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
  local_38;
  
  poVar7 = std::operator<<((ostream *)&std::cout,"Test UTF-8");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"- From UTF-8");
  std::endl<char,std::char_traits<char>>(poVar7);
  booster::locale::util::create_utf8_converter();
  test_counter = test_counter + 1;
  if (buf._0_8_ == 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x7b);
    poVar7 = std::operator<<(poVar7," cvt.get()");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  cVar4 = (**(code **)(*(long *)buf._0_8_ + 0x18))(buf._0_8_);
  if (cVar4 == '\0') {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x7c);
    poVar7 = std::operator<<(poVar7," cvt->is_thread_safe()");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x10))(buf._0_8_);
  if (iVar6 != 4) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x7d);
    poVar7 = std::operator<<(poVar7," cvt->max_len() == 4");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"-- Correct");
  std::endl<char,std::char_traits<char>>(poVar7);
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3f44 + 3,0x7f);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x81);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\x7f\",0x7f)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3d38,0x80);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x82);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xC2\\x80\",0x80)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3d4c,0x7ff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x83);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xdf\\xBF\",0x7FF)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3d60,0x800);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x84);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xe0\\xa0\\x80\",0x800)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3d8c,0xffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x85);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xef\\xbf\\xbf\",0xFFFF)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3dac,0x10000);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x86);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf0\\x90\\x80\\x80\",0x10000)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3dd8,0x10ffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x87);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf4\\x8f\\xbf\\xbf\",0x10FFFF)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"-- Too big");
  std::endl<char,std::char_traits<char>>(poVar7);
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3e02,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x8a);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf4\\x9f\\x80\\x80\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3e16,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x8b);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xfb\\xbf\\xbf\\xbf\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3e2a,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x8c);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf8\\x90\\x80\\x80\\x80\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3e56,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x8d);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xfd\\xbf\\xbf\\xbf\\xbf\\xbf\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"-- Invalid trail");
  std::endl<char,std::char_traits<char>>(poVar7);
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3e98,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x90);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xC2\\x7F\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3eac,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x91);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xdf\\x7F\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3ec0,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x92);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xe0\\x7F\\x80\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3ee0,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x93);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xef\\xbf\\x7F\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3ec0,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x94);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xe0\\x7F\\x80\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3ee0,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x95);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xef\\xbf\\x7F\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3ef4,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x96);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf0\\x7F\\x80\\x80\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3f08,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x97);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf4\\x7f\\xbf\\xbf\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3f1c,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x98);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf0\\x90\\x7F\\x80\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3f30,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x99);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf4\\x8f\\x7F\\xbf\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3f44,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x9a);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf0\\x90\\x80\\x7F\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3f58,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x9b);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf4\\x8f\\xbf\\x7F\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"-- Invalid length");
  std::endl<char,std::char_traits<char>>(poVar7);
  test_counter = test_counter + 1;
  make2::buf[0] = 0xc2;
  make2::buf[1] = 0x80;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make2::buf,0x80);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xa0);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make2(0x80),0x80)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make2::buf[0] = 0xdf;
  make2::buf[1] = 0xbf;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make2::buf,0x7ff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xa1);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make2(0x7ff),0x7ff)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0xa0;
  make3::buf[2] = 0x80;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make3::buf,0x800);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xa3);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make3(0x800),0x800)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xef;
  make3::buf[1] = 0xbf;
  make3::buf[2] = 0xbf;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make3::buf,0xffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xa4);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make3(0xffff),0xffff)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"𐀀",4);
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0x10000);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xa6);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0x10000),0x10000)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"\x0010ffff",4);
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0x10ffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xa7);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0x10ffff),0x10ffff)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make4::buf[0] = 0xf4;
  make4::buf[1] = 0x90;
  make4::buf[2] = 0x80;
  make4::buf[3] = 0x80;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xa9);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0x110000),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make4::buf[0] = 0xf7;
  make4::buf[1] = 0xbf;
  make4::buf[2] = 0xbf;
  make4::buf[3] = 0xbf;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xaa);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0x1fffff),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make2::buf[0] = 0xc0;
  make2::buf[1] = 0x80;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make2::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xac);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make2(0),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0x80;
  make3::buf[2] = 0x80;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make3::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xad);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make3(0),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"",4);
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xae);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make2::buf[0] = 0xc1;
  make2::buf[1] = 0xbf;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make2::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xaf);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make2(0x7f),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0x81;
  make3::buf[2] = 0xbf;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make3::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xb0);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make3(0x7f),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"\x7f",4);
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xb1);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0x7f),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0x82;
  make3::buf[2] = 0x80;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make3::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xb3);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make3(0x80),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"\x80",4);
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xb4);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0x80),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xe0;
  make3::buf[1] = 0x9f;
  make3::buf[2] = 0xbf;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make3::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xb5);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make3(0x7ff),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"߿",4);
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xb6);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0x7ff),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"耀",4);
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xb8);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0x8000),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  builtin_memcpy(make4::buf,"\xffff",4);
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xb9);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0xffff),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"-- Invalid surrogate");
  std::endl<char,std::char_traits<char>>(poVar7);
  test_counter = test_counter + 1;
  make3::buf[0] = 0xed;
  make3::buf[1] = 0xa0;
  make3::buf[2] = 0x80;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make3::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xbd);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make3(0xD800),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xed;
  make3::buf[1] = 0xaf;
  make3::buf[2] = 0xbf;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make3::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xbe);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make3(0xDBFF),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xed;
  make3::buf[1] = 0xb0;
  make3::buf[2] = 0x80;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make3::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xbf);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make3(0xDC00),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make3::buf[0] = 0xed;
  make3::buf[1] = 0xbf;
  make3::buf[2] = 0xbf;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make3::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xc0);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make3(0xDFFF),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make4::buf[0] = 0xf0;
  make4::buf[1] = 0x8d;
  make4::buf[2] = 0xa0;
  make4::buf[3] = 0x80;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xc2);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0xD800),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make4::buf[0] = 0xf0;
  make4::buf[1] = 0x8d;
  make4::buf[2] = 0xaf;
  make4::buf[3] = 0xbf;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xc3);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0xDBFF),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make4::buf[0] = 0xf0;
  make4::buf[1] = 0x8d;
  make4::buf[2] = 0xb0;
  make4::buf[3] = 0x80;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xc4);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0xDC00),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  make4::buf[0] = 0xf0;
  make4::buf[1] = 0x8d;
  make4::buf[2] = 0xbf;
  make4::buf[3] = 0xbf;
  bVar5 = test_to((base_converter *)buf._0_8_,(char *)make4::buf,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xc5);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,make4(0xDFFF),illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"-- Incomplete");
  std::endl<char,std::char_traits<char>>(poVar7);
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3f1c + 3,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xc9);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\x80\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_40e6,0xfffffffe);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xca);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xC2\",incomplete)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_40fa,0xfffffffe);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xcc);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xdf\",incomplete)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_410e,0xfffffffe);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xce);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xe0\",incomplete)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_4122,0xfffffffe);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xcf);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xe0\\xa0\",incomplete)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_4136,0xfffffffe);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xd1);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xef\\xbf\",incomplete)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_414a,0xfffffffe);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xd2);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xef\",incomplete)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_4160,0xfffffffe);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xd4);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf0\\x90\\x80\",incomplete)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_4176,0xfffffffe);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xd5);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf0\\x90\",incomplete)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_3c7a + 1,0xfffffffe);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xd6);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf0\",incomplete)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_41a2,0xfffffffe);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xd8);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf4\\x8f\\xbf\",incomplete)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_41b8,0xfffffffe);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xd9);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf4\\x8f\",incomplete)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to((base_converter *)buf._0_8_,anon_var_dwarf_41ce,0xfffffffe);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xda);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xf4\",incomplete)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"- To UTF-8");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"-- Test correct");
  std::endl<char,std::char_traits<char>>(poVar7);
  test_counter = test_counter + 1;
  bVar5 = test_from((base_converter *)buf._0_8_,0x7f,anon_var_dwarf_3f44 + 3);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xe0);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0x7f,\"\\x7f\")");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_from((base_converter *)buf._0_8_,0x80,anon_var_dwarf_3d38);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xe1);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0x80,\"\\xC2\\x80\")");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_from((base_converter *)buf._0_8_,0x7ff,anon_var_dwarf_3d4c);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xe2);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0x7FF,\"\\xdf\\xBF\")");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x30))(buf._0_8_,0x7ff,buf,buf + 1);
  if (iVar6 != -2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xe3);
    poVar7 = std::operator<<(poVar7," test_incomplete(*cvt,0x7FF,1)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_from((base_converter *)buf._0_8_,0x800,anon_var_dwarf_3d60);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xe4);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0x800,\"\\xe0\\xa0\\x80\")");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x30))(buf._0_8_,0x800,buf,buf + 2);
  if (iVar6 != -2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xe5);
    poVar7 = std::operator<<(poVar7," test_incomplete(*cvt,0x800,2)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x30))(buf._0_8_,0x800,buf,buf + 1);
  if (iVar6 != -2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xe6);
    poVar7 = std::operator<<(poVar7," test_incomplete(*cvt,0x800,1)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_from((base_converter *)buf._0_8_,0xffff,anon_var_dwarf_3d8c);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xe7);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0xFFFF,\"\\xef\\xbf\\xbf\")");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x30))(buf._0_8_,0x10000,buf,buf + 3);
  if (iVar6 != -2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xe8);
    poVar7 = std::operator<<(poVar7," test_incomplete(*cvt,0x10000,3)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x30))(buf._0_8_,0x10000,buf,buf + 2);
  if (iVar6 != -2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xe9);
    poVar7 = std::operator<<(poVar7," test_incomplete(*cvt,0x10000,2)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x30))(buf._0_8_,0x10000,buf,buf + 1);
  if (iVar6 != -2) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xea);
    poVar7 = std::operator<<(poVar7," test_incomplete(*cvt,0x10000,1)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_from((base_converter *)buf._0_8_,0x10000,anon_var_dwarf_3dac);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xeb);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0x10000,\"\\xf0\\x90\\x80\\x80\")");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_from((base_converter *)buf._0_8_,0x10ffff,anon_var_dwarf_3dd8);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xec);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0x10FFFF,\"\\xf4\\x8f\\xbf\\xbf\")");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"-- Test no surrogate ");
  std::endl<char,std::char_traits<char>>(poVar7);
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x30))(buf._0_8_,0xd800,buf,local_48);
  if (iVar6 != -1) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xf0);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0xD800,0)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x30))(buf._0_8_,0xdbff,buf,local_48);
  if (iVar6 != -1) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xf1);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0xDBFF,0)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x30))(buf._0_8_,0xdc00,buf,local_48);
  if (iVar6 != -1) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xf2);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0xDC00,0)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x30))(buf._0_8_,0xdfff,buf,local_48);
  if (iVar6 != -1) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xf3);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0xDFFF,0)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"-- Test invalid ");
  std::endl<char,std::char_traits<char>>(poVar7);
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x30))(buf._0_8_,std::terminate,buf,local_48);
  if (iVar6 != -1) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xf7);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0x110000,0)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)buf._0_8_ + 0x30))(buf._0_8_,0x1fffff,buf,local_48);
  if (iVar6 != -1) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xf8);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0x1FFFFF,0)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"Test windows-1255");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::string((string *)buf,"windows-1255",&local_41);
  booster::locale::util::create_simple_converter((string *)&local_70);
  _Var2._M_head_impl = local_70._M_head_impl;
  local_70._M_head_impl = (base_converter *)0x0;
  if ((buf._0_8_ != 0) &&
     ((**(code **)(*(long *)buf._0_8_ + 8))(buf._0_8_),
     local_70._M_head_impl != (base_converter *)0x0)) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
  local_70._M_head_impl = (base_converter *)0x0;
  std::__cxx11::string::~string((string *)buf);
  test_counter = test_counter + 1;
  if (_Var2._M_head_impl == (base_converter *)0x0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0xff);
    poVar7 = std::operator<<(poVar7," cvt.get()");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  cVar4 = (**(code **)(*(long *)_Var2._M_head_impl + 0x18))(_Var2._M_head_impl);
  if (cVar4 == '\0') {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x100);
    poVar7 = std::operator<<(poVar7," cvt->is_thread_safe()");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)_Var2._M_head_impl + 0x10))(_Var2._M_head_impl);
  if (iVar6 != 1) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x101);
    poVar7 = std::operator<<(poVar7," cvt->max_len() == 1");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"- From 1255");
  std::endl<char,std::char_traits<char>>(poVar7);
  test_counter = test_counter + 1;
  bVar5 = test_to(_Var2._M_head_impl,anon_var_dwarf_4365,0x20aa);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x105);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xa4\",0x20aa)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to(_Var2._M_head_impl,anon_var_dwarf_410e,0x5d0);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x106);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xe0\",0x05d0)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to(_Var2._M_head_impl,anon_var_dwarf_438c,0x5b4);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x107);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xc4\",0x5b4)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to(_Var2._M_head_impl,anon_var_dwarf_43a6,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x108);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xfb\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to(_Var2._M_head_impl,anon_var_dwarf_43c0,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x109);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xdd\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to(_Var2._M_head_impl,anon_var_dwarf_43da,0xffffffff);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x10a);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xff\",illegal)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_to(_Var2._M_head_impl,anon_var_dwarf_43f4,0x200f);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x10b);
    poVar7 = std::operator<<(poVar7," test_to(*cvt,\"\\xfe\",0x200f)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"- To 1255");
  std::endl<char,std::char_traits<char>>(poVar7);
  test_counter = test_counter + 1;
  bVar5 = test_from(_Var2._M_head_impl,0x20aa,anon_var_dwarf_4365);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x10f);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0x20aa,\"\\xa4\")");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_from(_Var2._M_head_impl,0x5d0,anon_var_dwarf_410e);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x110);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0x05d0,\"\\xe0\")");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_from(_Var2._M_head_impl,0x5b4,anon_var_dwarf_438c);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x111);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0x5b4,\"\\xc4\")");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  bVar5 = test_from(_Var2._M_head_impl,0x200f,anon_var_dwarf_43f4);
  if (!bVar5) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x112);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0x200f,\"\\xfe\")");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)_Var2._M_head_impl + 0x30))(_Var2._M_head_impl,0xe4,buf,local_48);
  if (iVar6 != -1) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x114);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0xe4,0)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  iVar6 = (**(code **)(*(long *)_Var2._M_head_impl + 0x30))(_Var2._M_head_impl,0xd0,buf,local_48);
  if (iVar6 != -1) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x115);
    poVar7 = std::operator<<(poVar7," test_from(*cvt,0xd0,0)");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"Testing Shift-JIS using ICU/uconv");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::string((string *)buf,"Shift-JIS",&local_41);
  booster::locale::impl_icu::create_uconv_converter((string *)&local_70);
  _Var3._M_head_impl = local_70._M_head_impl;
  local_70._M_head_impl = (base_converter *)0x0;
  (**(code **)(*(long *)_Var2._M_head_impl + 8))(_Var2._M_head_impl);
  if (local_70._M_head_impl != (base_converter *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
  local_70._M_head_impl = (base_converter *)0x0;
  std::__cxx11::string::~string((string *)buf);
  test_counter = test_counter + 1;
  if ((_Head_base<0UL,_booster::locale::util::base_converter_*,_false>)_Var3._M_head_impl ==
      (_Head_base<0UL,_booster::locale::util::base_converter_*,_false>)0x0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x11b);
    poVar7 = std::operator<<(poVar7," cvt.get()");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar6 = error_counter + 1;
    bVar5 = 0x14 < error_counter;
    error_counter = iVar6;
    if (bVar5) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)buf,"Error limits reached, stopping unit test",(allocator *)&local_70);
      booster::runtime_error::runtime_error(prVar8,(string *)buf);
      __cxa_throw(prVar8,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  local_40._M_t.
  super__Tuple_impl<0UL,_booster::locale::util::base_converter_*,_std::default_delete<booster::locale::util::base_converter>_>
  .super__Head_base<0UL,_booster::locale::util::base_converter_*,_false>._M_head_impl =
       (tuple<booster::locale::util::base_converter_*,_std::default_delete<booster::locale::util::base_converter>_>
        )(tuple<booster::locale::util::base_converter_*,_std::default_delete<booster::locale::util::base_converter>_>
          )_Var3._M_head_impl;
  test_shiftjis((unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
                 *)&local_40);
  if (_Var3._M_head_impl != (base_converter *)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 8))(_Var3._M_head_impl);
  }
  local_40._M_t.
  super__Tuple_impl<0UL,_booster::locale::util::base_converter_*,_std::default_delete<booster::locale::util::base_converter>_>
  .super__Head_base<0UL,_booster::locale::util::base_converter_*,_false>._M_head_impl =
       (tuple<booster::locale::util::base_converter_*,_std::default_delete<booster::locale::util::base_converter>_>
        )(_Tuple_impl<0UL,_booster::locale::util::base_converter_*,_std::default_delete<booster::locale::util::base_converter>_>
          )0x0;
  poVar7 = std::operator<<((ostream *)&std::cout,"Testing Shift-JIS using POSIX/iconv");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::string((string *)buf,"Shift-JIS",&local_41);
  booster::locale::impl_posix::create_iconv_converter((string *)&local_70);
  _Var2._M_head_impl = local_70._M_head_impl;
  local_70._M_head_impl = (base_converter *)0x0;
  std::__cxx11::string::~string((string *)buf);
  if ((tuple<booster::locale::util::base_converter_*,_std::default_delete<booster::locale::util::base_converter>_>
       )_Var2._M_head_impl == (_Head_base<0UL,_booster::locale::util::base_converter_*,_false>)0x0)
  {
    poVar7 = std::operator<<((ostream *)&std::cout,"- Shift-JIS is not supported!");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    local_38._M_t.
    super___uniq_ptr_impl<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
    ._M_t.
    super__Tuple_impl<0UL,_booster::locale::util::base_converter_*,_std::default_delete<booster::locale::util::base_converter>_>
    .super__Head_base<0UL,_booster::locale::util::base_converter_*,_false>._M_head_impl =
         (__uniq_ptr_data<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>,_true,_true>
          )(__uniq_ptr_data<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>,_true,_true>
            )_Var2._M_head_impl;
    test_shiftjis(&local_38);
    (**(code **)(*(long *)_Var2._M_head_impl + 8))(_Var2._M_head_impl);
  }
  iVar6 = test_counter - error_counter;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar7 = std::operator<<((ostream *)&std::cout,"Passed ");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar6);
  poVar7 = std::operator<<(poVar7," tests");
  std::endl<char,std::char_traits<char>>(poVar7);
  if (0 < error_counter) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Failed ");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,error_counter);
    poVar7 = std::operator<<(poVar7," tests");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  poVar7 = std::operator<<((ostream *)&std::cout," ");
  lVar1 = *(long *)poVar7;
  *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 8) = 1;
  *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  poVar7 = std::ostream::_M_insert<double>(((double)iVar6 * 100.0) / (double)test_counter);
  poVar7 = std::operator<<(poVar7,"% of tests completed sucsessefully");
  std::endl<char,std::char_traits<char>>(poVar7);
  return (int)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        using namespace booster::locale::util;

        std::unique_ptr<base_converter> cvt;

        std::cout << "Test UTF-8" << std::endl;
        std::cout << "- From UTF-8" << std::endl;


        cvt = create_utf8_converter();
        TEST(cvt.get());
        TEST(cvt->is_thread_safe());
        TEST(cvt->max_len() == 4);

        std::cout << "-- Correct" << std::endl;

        TEST_TO("\x7f",0x7f);
        TEST_TO("\xC2\x80",0x80);
        TEST_TO("\xdf\xBF",0x7FF);
        TEST_TO("\xe0\xa0\x80",0x800);
        TEST_TO("\xef\xbf\xbf",0xFFFF);
        TEST_TO("\xf0\x90\x80\x80",0x10000);
        TEST_TO("\xf4\x8f\xbf\xbf",0x10FFFF);

        std::cout << "-- Too big" << std::endl;
        TEST_TO("\xf4\x9f\x80\x80",illegal); //  11 0000
        TEST_TO("\xfb\xbf\xbf\xbf",illegal); // 3FF FFFF
        TEST_TO("\xf8\x90\x80\x80\x80",illegal);  // 400 0000
        TEST_TO("\xfd\xbf\xbf\xbf\xbf\xbf",illegal);  // 7fff ffff

        std::cout << "-- Invalid trail" << std::endl;
        TEST_TO("\xC2\x7F",illegal);
        TEST_TO("\xdf\x7F",illegal);
        TEST_TO("\xe0\x7F\x80",illegal);
        TEST_TO("\xef\xbf\x7F",illegal);
        TEST_TO("\xe0\x7F\x80",illegal);
        TEST_TO("\xef\xbf\x7F",illegal);
        TEST_TO("\xf0\x7F\x80\x80",illegal);
        TEST_TO("\xf4\x7f\xbf\xbf",illegal);
        TEST_TO("\xf0\x90\x7F\x80",illegal);
        TEST_TO("\xf4\x8f\x7F\xbf",illegal);
        TEST_TO("\xf0\x90\x80\x7F",illegal);
        TEST_TO("\xf4\x8f\xbf\x7F",illegal);

        std::cout << "-- Invalid length" << std::endl;

        /// Test that this actually works
        TEST_TO(make2(0x80),0x80);
        TEST_TO(make2(0x7ff),0x7ff);

        TEST_TO(make3(0x800),0x800);
        TEST_TO(make3(0xffff),0xffff);

        TEST_TO(make4(0x10000),0x10000);
        TEST_TO(make4(0x10ffff),0x10ffff);

        TEST_TO(make4(0x110000),illegal);
        TEST_TO(make4(0x1fffff),illegal);
        
        TEST_TO(make2(0),illegal);
        TEST_TO(make3(0),illegal);
        TEST_TO(make4(0),illegal);
        TEST_TO(make2(0x7f),illegal);
        TEST_TO(make3(0x7f),illegal);
        TEST_TO(make4(0x7f),illegal);

        TEST_TO(make3(0x80),illegal);
        TEST_TO(make4(0x80),illegal);
        TEST_TO(make3(0x7ff),illegal);
        TEST_TO(make4(0x7ff),illegal);

        TEST_TO(make4(0x8000),illegal);
        TEST_TO(make4(0xffff),illegal);
        
        std::cout << "-- Invalid surrogate" << std::endl;
        
        TEST_TO(make3(0xD800),illegal);
        TEST_TO(make3(0xDBFF),illegal);
        TEST_TO(make3(0xDC00),illegal);
        TEST_TO(make3(0xDFFF),illegal);

        TEST_TO(make4(0xD800),illegal);
        TEST_TO(make4(0xDBFF),illegal);
        TEST_TO(make4(0xDC00),illegal);
        TEST_TO(make4(0xDFFF),illegal);

        std::cout <<"-- Incomplete" << std::endl;

        TEST_TO("\x80",illegal);
        TEST_TO("\xC2",incomplete);
        
        TEST_TO("\xdf",incomplete);

        TEST_TO("\xe0",incomplete);
        TEST_TO("\xe0\xa0",incomplete);

        TEST_TO("\xef\xbf",incomplete);
        TEST_TO("\xef",incomplete);

        TEST_TO("\xf0\x90\x80",incomplete);
        TEST_TO("\xf0\x90",incomplete);
        TEST_TO("\xf0",incomplete);

        TEST_TO("\xf4\x8f\xbf",incomplete);
        TEST_TO("\xf4\x8f",incomplete);
        TEST_TO("\xf4",incomplete);

        std::cout << "- To UTF-8" << std::endl;

        std::cout << "-- Test correct" << std::endl;

        TEST_FROM("\x7f",0x7f);
        TEST_FROM("\xC2\x80",0x80);
        TEST_FROM("\xdf\xBF",0x7FF);
        TEST_INC(0x7FF,1);
        TEST_FROM("\xe0\xa0\x80",0x800);
        TEST_INC(0x800,2);
        TEST_INC(0x800,1);
        TEST_FROM("\xef\xbf\xbf",0xFFFF);
        TEST_INC(0x10000,3);
        TEST_INC(0x10000,2);
        TEST_INC(0x10000,1);
        TEST_FROM("\xf0\x90\x80\x80",0x10000);
        TEST_FROM("\xf4\x8f\xbf\xbf",0x10FFFF);
       
        std::cout << "-- Test no surrogate " << std::endl;
         
        TEST_FROM(0,0xD800);
        TEST_FROM(0,0xDBFF);
        TEST_FROM(0,0xDC00);
        TEST_FROM(0,0xDFFF);
        
        std::cout << "-- Test invalid " << std::endl;
        
        TEST_FROM(0,0x110000);
        TEST_FROM(0,0x1FFFFF);


        std::cout << "Test windows-1255" << std::endl;

        cvt = create_simple_converter("windows-1255");

        TEST(cvt.get());
        TEST(cvt->is_thread_safe());
        TEST(cvt->max_len() == 1);

        std::cout << "- From 1255" << std::endl;

        TEST_TO("\xa4",0x20aa);
        TEST_TO("\xe0",0x05d0);
        TEST_TO("\xc4",0x5b4);
        TEST_TO("\xfb",illegal);
        TEST_TO("\xdd",illegal);
        TEST_TO("\xff",illegal);
        TEST_TO("\xfe",0x200f);

        std::cout << "- To 1255" << std::endl;

        TEST_FROM("\xa4",0x20aa);
        TEST_FROM("\xe0",0x05d0);
        TEST_FROM("\xc4",0x5b4);
        TEST_FROM("\xfe",0x200f);

        TEST_FROM(0,0xe4);
        TEST_FROM(0,0xd0);

        #ifdef BOOSTER_LOCALE_WITH_ICU
        std::cout << "Testing Shift-JIS using ICU/uconv" << std::endl;

        cvt = booster::locale::impl_icu::create_uconv_converter("Shift-JIS");
        TEST(cvt.get());
        test_shiftjis(std::move(cvt));
        #endif

        #if defined(BOOSTER_LOCALE_WITH_ICONV) && !defined(BOOSTER_LOCALE_NO_POSIX_BACKEND)
        std::cout << "Testing Shift-JIS using POSIX/iconv" << std::endl;

        cvt = booster::locale::impl_posix::create_iconv_converter("Shift-JIS");
        if(cvt.get()) {
            test_shiftjis(std::move(cvt));
        }
        else {
            std::cout<< "- Shift-JIS is not supported!" << std::endl;
        }
        #endif

    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();
}